

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O1

string * __thiscall
Disassembler::getLabel_abi_cxx11_(string *__return_storage_ptr__,Disassembler *this,int line)

{
  pointer ppVar1;
  pointer pcVar2;
  pointer ppVar3;
  ulong uVar4;
  int iVar5;
  pointer ppVar6;
  ulong uVar7;
  bool bVar8;
  
  bVar8 = (long)labels_abi_cxx11_.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)labels_abi_cxx11_.
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0;
  if (bVar8) {
    uVar4 = ((long)labels_abi_cxx11_.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)labels_abi_cxx11_.
                   super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    iVar5 = (int)this + 2;
    ppVar6 = labels_abi_cxx11_.
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((labels_abi_cxx11_.
         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->first != iVar5) {
      uVar7 = 0;
      ppVar3 = labels_abi_cxx11_.
               super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        if ((uVar4 + (uVar4 == 0)) - 1 == uVar7) goto LAB_00127bdc;
        ppVar6 = ppVar3 + 1;
        uVar7 = uVar7 + 1;
        ppVar1 = ppVar3 + 1;
        ppVar3 = ppVar6;
      } while (ppVar1->first != iVar5);
      bVar8 = uVar7 <= uVar4 && uVar4 - uVar7 != 0;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (ppVar6->second)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (ppVar6->second)._M_string_length);
    if (bVar8) {
      return __return_storage_ptr__;
    }
  }
LAB_00127bdc:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::getLabel(int line){
  for(int i = 0;i < labels.size();i++)
    if(labels[i].first == line+2) {// .globl e .text
      return labels[i].second;
    }
  return "";
}